

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O3

void __thiscall
amrex::Geometry::periodicShift
          (Geometry *this,Box *target,Box *src,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *out)

{
  pointer *ppIVar1;
  iterator __position;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Box locsrc;
  Box local_68;
  IntVect local_44;
  Box *local_38;
  
  local_38 = target;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&out->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,0);
  local_68.smallend.vect._0_8_ = *(undefined8 *)(src->smallend).vect;
  uVar2 = *(undefined8 *)((src->smallend).vect + 2);
  local_68._20_8_ = *(undefined8 *)((src->bigend).vect + 2);
  local_68.bigend.vect[1] = (int)((ulong)*(undefined8 *)(src->bigend).vect >> 0x20);
  local_68.smallend.vect[2] = (int)uVar2;
  local_68.bigend.vect[0] = (int)((ulong)uVar2 >> 0x20);
  iVar7 = -1;
  do {
    if (iVar7 == 0) {
LAB_0047fe71:
      iVar4 = -1;
      do {
        if (iVar4 == 0) {
LAB_0047fea3:
          iVar5 = -1;
          do {
            if (iVar5 == 0) {
LAB_0047fedb:
              if ((iVar4 != 0 || iVar7 != 0) || iVar5 != 0) {
                bVar3 = Box::intersects(local_38,&local_68);
                if (bVar3) {
                  local_44.vect[0] =
                       (((this->domain).bigend.vect[0] - (this->domain).smallend.vect[0]) + 1) *
                       iVar7;
                  local_44.vect[1] =
                       (((this->domain).bigend.vect[1] - (this->domain).smallend.vect[1]) + 1) *
                       iVar4;
                  local_44.vect[2] =
                       (((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1) *
                       iVar5;
                  __position._M_current =
                       (out->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                       super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (out->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::
                    _M_realloc_insert<amrex::IntVect>
                              (&out->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,
                               __position,&local_44);
                  }
                  else {
                    (__position._M_current)->vect[2] = local_44.vect[2];
                    *(ulong *)(__position._M_current)->vect =
                         CONCAT44(local_44.vect[1],local_44.vect[0]);
                    ppIVar1 = &(out->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppIVar1 = *ppIVar1 + 1;
                  }
                }
                if ((iVar5 != 0) && ((this->super_CoordSys).field_0x53 == '\x01')) {
                  iVar6 = (~(this->domain).bigend.vect[2] + (this->domain).smallend.vect[2]) * iVar5
                  ;
                  local_68.smallend.vect[2] = local_68.smallend.vect[2] + iVar6;
                  local_68.bigend.vect[2] = local_68.bigend.vect[2] + iVar6;
                }
              }
            }
            else if ((this->super_CoordSys).field_0x53 == '\x01') {
              iVar6 = (((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1) *
                      iVar5;
              local_68.smallend.vect[2] = local_68.smallend.vect[2] + iVar6;
              local_68.bigend.vect[2] = local_68.bigend.vect[2] + iVar6;
              goto LAB_0047fedb;
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 != 2);
          if ((iVar4 != 0) && ((this->super_CoordSys).field_0x52 == '\x01')) {
            iVar5 = (~(this->domain).bigend.vect[1] + (this->domain).smallend.vect[1]) * iVar4;
            local_68.smallend.vect[1] = local_68.smallend.vect[1] + iVar5;
            local_68.bigend.vect[1] = local_68.bigend.vect[1] + iVar5;
          }
        }
        else if ((this->super_CoordSys).field_0x52 == '\x01') {
          iVar5 = (((this->domain).bigend.vect[1] - (this->domain).smallend.vect[1]) + 1) * iVar4;
          local_68.smallend.vect[1] = local_68.smallend.vect[1] + iVar5;
          local_68.bigend.vect[1] = local_68.bigend.vect[1] + iVar5;
          goto LAB_0047fea3;
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 != 2);
      if ((iVar7 != 0) && ((this->super_CoordSys).field_0x51 == '\x01')) {
        iVar4 = (~(this->domain).bigend.vect[0] + (this->domain).smallend.vect[0]) * iVar7;
        local_68.smallend.vect[0] = local_68.smallend.vect[0] + iVar4;
        local_68.bigend.vect[0] = local_68.bigend.vect[0] + iVar4;
      }
    }
    else if ((this->super_CoordSys).field_0x51 == '\x01') {
      iVar4 = (((this->domain).bigend.vect[0] - (this->domain).smallend.vect[0]) + 1) * iVar7;
      local_68.smallend.vect[0] = local_68.smallend.vect[0] + iVar4;
      local_68.bigend.vect[0] = local_68.bigend.vect[0] + iVar4;
      goto LAB_0047fe71;
    }
    iVar7 = iVar7 + 1;
    if (iVar7 == 2) {
      return;
    }
  } while( true );
}

Assistant:

void
Geometry::periodicShift (const Box&      target,
                         const Box&      src,
                         Vector<IntVect>& out) const noexcept
{
    out.resize(0);

    Box locsrc(src);

    int nist  = -1;
    int niend =  1;
#if (AMREX_SPACEDIM > 1)
    int njst  = -1;
    int njend =  1;
#else
    int njst  = 0;
    int njend = 0;
#endif
#if (AMREX_SPACEDIM > 2)
    int nkst  = -1;
    int nkend =  1;
#else
    int nkst  = 0;
    int nkend = 0;
#endif

    int ri,rj,rk;
    for (ri = nist; ri <= niend; ri++)
    {
        if (ri != 0 && !is_periodic[0])
            continue;
        if (ri != 0 && is_periodic[0])
            locsrc.shift(0,ri*domain.length(0));

        for (rj = njst; rj <= njend; rj++)
        {
            if (rj != 0
#if (AMREX_SPACEDIM > 1)
                && !is_periodic[1]
#endif
                )
            {
                continue;
            }
            if (rj != 0
#if (AMREX_SPACEDIM > 1)
                && is_periodic[1]
#endif
                )
            {
                locsrc.shift(1,rj*domain.length(1));
            }

            for (rk = nkst; rk <= nkend; rk++)
            {
                if (rk!=0
#if (AMREX_SPACEDIM == 3)
                    && !is_periodic[2]
#endif
                    )
                {
                    continue;
                }
                if (rk!=0
#if (AMREX_SPACEDIM == 3)
                    && is_periodic[2]
#endif
                    )
                {
                    locsrc.shift(2,rk*domain.length(2));
                }

                if (ri == 0 && rj == 0 && rk == 0)
                    continue;
                //
                // If losrc intersects target, then add to "out".
                //
                if (target.intersects(locsrc))
                {
                    out.push_back(IntVect(AMREX_D_DECL(ri*domain.length(0),
                                                 rj*domain.length(1),
                                                 rk*domain.length(2))));
                }
                if (rk != 0
#if (AMREX_SPACEDIM == 3)
                    && is_periodic[2]
#endif
                    )
                {
                    locsrc.shift(2,-rk*domain.length(2));
                }
            }
            if (rj != 0
#if (AMREX_SPACEDIM > 1)
                && is_periodic[1]
#endif
                )
            {
                locsrc.shift(1,-rj*domain.length(1));
            }
        }
        if (ri != 0 && is_periodic[0])
            locsrc.shift(0,-ri*domain.length(0));
    }
}